

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O3

void __thiscall
entityx::EventManager::unsubscribe<Explosion,ExplosionSystem>
          (EventManager *this,ExplosionSystem *receiver)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this_01;
  size_t connection;
  _Atomic_word _Var3;
  mapped_type *pmVar4;
  unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
  *this_02;
  bool bVar5;
  Family local_18;
  
  this_02 = &(receiver->super_Receiver<ExplosionSystem>).super_BaseReceiver.connections_;
  local_18 = Event<Explosion>::family();
  pmVar4 = Catch::clara::std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_02,&local_18);
  this_00 = (pmVar4->first).
            super___weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = &((pmVar4->first).
                super___weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->
               super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_weak_count = this_00->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_weak_count = this_00->_M_weak_count + 1;
    }
    connection = pmVar4->second;
    if (this_00->_M_use_count != 0) {
      _Var3 = this_00->_M_use_count;
      do {
        LOCK();
        iVar2 = this_00->_M_use_count;
        bVar5 = _Var3 == iVar2;
        if (bVar5) {
          this_00->_M_use_count = _Var3 + 1;
          iVar2 = _Var3;
        }
        _Var3 = iVar2;
        UNLOCK();
      } while (!bVar5);
      Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
      disconnect(this_01,connection);
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  local_18 = Event<Explosion>::family();
  Catch::clara::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&this_02->_M_h);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &this_00->_M_weak_count;
      _Var3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      _Var3 = this_00->_M_weak_count;
      this_00->_M_weak_count = _Var3 + -1;
    }
    if (_Var3 == 1) {
      (*this_00->_vptr__Sp_counted_base[3])(this_00);
    }
  }
  return;
}

Assistant:

void unsubscribe(Receiver &receiver) {
    BaseReceiver &base = receiver;
    // Assert that it has been subscribed before
    assert(base.connections_.find(Event<E>::family()) != base.connections_.end());
    auto pair = base.connections_[Event<E>::family()];
    auto connection = pair.second;
    auto &ptr = pair.first;
    if (!ptr.expired()) {
      ptr.lock()->disconnect(connection);
    }
    base.connections_.erase(Event<E>::family());
  }